

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

void binbuf_text(_binbuf *x,char *text,size_t size)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  t_symbol *ptVar7;
  long lVar8;
  t_atom *ptVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  byte bVar15;
  uint uVar16;
  byte *pbVar17;
  bool bVar18;
  double dVar19;
  char buf [1001];
  
  binbuf_clear(x);
  uVar11 = 0x10;
  iVar5 = binbuf_resize(x,0x10);
  if (iVar5 != 0) {
    pbVar17 = (byte *)(text + size);
    ptVar9 = x->b_vec;
    uVar12 = 0;
LAB_00162126:
    do {
      if ((byte *)text == pbVar17) break;
      uVar6 = (ulong)(byte)*text;
      if (uVar6 < 0x3c) {
        if ((0x100002600U >> (uVar6 & 0x3f) & 1) != 0) {
          text = (char *)((byte *)text + 1);
          goto LAB_00162126;
        }
        if (uVar6 == 0x2c) {
          ptVar9->a_type = A_COMMA;
        }
        else {
          if (uVar6 != 0x3b) goto LAB_0016215f;
          ptVar9->a_type = A_SEMI;
        }
        (ptVar9->a_w).w_float = 0.0;
        text = (char *)((byte *)text + 1);
      }
      else {
LAB_0016215f:
        uVar10 = 0;
        bVar4 = false;
        lVar8 = 0;
        do {
          bVar3 = false;
          pbVar2 = (byte *)text;
          do {
            text = (char *)(pbVar2 + 1);
            bVar1 = *pbVar2;
            buf[lVar8] = bVar1;
            if (-1 < (int)uVar10) {
              bVar15 = bVar1 - 0x30;
              if (uVar10 < 8) {
                switch(uVar10) {
                case 0:
                  uVar10 = 1;
                  if (bVar1 != 0x2d) goto switchD_001621b3_caseD_1;
                  break;
                case 1:
switchD_001621b3_caseD_1:
                  uVar10 = (uint)(bVar1 == 0x2e) * 4 - 1;
                  if (bVar15 < 10) {
                    uVar10 = 2;
                  }
                  break;
                case 2:
                  if ((bVar1 - 0x2e < 0x38) &&
                     ((0x80000000800001U >> ((ulong)(bVar1 - 0x2e) & 0x3f) & 1) != 0)) {
                    uVar10 = (uint)(bVar1 != 0x2e) * 2 + 4;
                  }
                  else {
                    uVar10 = (bVar15 < 10) - 1 | 2;
                  }
                  break;
                case 3:
                  uVar10 = (bVar15 < 10) - 1 | 5;
                  break;
                case 4:
                  uVar10 = -(uint)((bVar1 & 0xdf) != 0x45) | 6;
                  if (bVar15 < 10) {
                    uVar10 = 5;
                  }
                  break;
                case 5:
                  uVar10 = (bVar15 < 10) - 1 | 5;
                  if ((bVar1 & 0xdf) == 0x45) {
                    uVar10 = 6;
                  }
                  break;
                case 6:
                  uVar10 = 7;
                  if ((bVar1 != 0x2b) && (uVar10 = 7, bVar1 != 0x2d)) goto switchD_001621b3_caseD_7;
                  break;
                case 7:
switchD_001621b3_caseD_7:
                  uVar10 = (bVar15 < 10) - 1 | 8;
                }
              }
              else {
                uVar16 = 0xffffffff;
                if (bVar15 < 10) {
                  uVar16 = uVar10;
                }
                if (uVar10 == 8) {
                  uVar10 = uVar16;
                }
              }
            }
            bVar18 = (byte *)text == pbVar17;
            if ((!(bool)(bVar1 != 0x24 | bVar3)) && ((byte *)text != pbVar17)) {
              if ((byte)(*text - 0x30U) < 10) {
                bVar4 = true;
              }
              bVar18 = false;
LAB_0016232a:
              pcVar13 = buf + lVar8 + 1;
              if ((bVar18) || (lVar8 == 999)) goto LAB_0016237e;
              goto LAB_00162343;
            }
            if (bVar1 != 0x5c) goto LAB_0016232a;
            lVar14 = lVar8;
            if (bVar3) {
              lVar14 = lVar8 + 1;
            }
            if (((byte *)text == pbVar17) || (lVar14 == 1000)) {
              pcVar13 = buf + lVar14;
              goto LAB_0016237e;
            }
            bVar18 = !bVar3;
            bVar3 = true;
            pbVar2 = (byte *)text;
          } while (bVar18);
          pcVar13 = buf + lVar8 + 1;
LAB_00162343:
          lVar8 = lVar8 + 1;
        } while ((0x3b < (ulong)(byte)*text) ||
                ((0x800100100002600U >> ((ulong)(byte)*text & 0x3f) & 1) == 0));
LAB_0016237e:
        *pcVar13 = '\0';
        if ((uVar10 < 9) && ((0x134U >> (uVar10 & 0x1f) & 1) != 0)) {
          ptVar9->a_type = A_FLOAT;
          dVar19 = atof(buf);
          (ptVar9->a_w).w_float = (float)dVar19;
        }
        else if (bVar4) {
          pcVar13 = buf;
          bVar4 = buf[0] == '$';
          while( true ) {
            pcVar13 = pcVar13 + 1;
            if (*pcVar13 == '\0') break;
            if ((byte)(*pcVar13 - 0x3aU) < 0xf6) {
              bVar4 = false;
            }
          }
          if (bVar4) {
            ptVar9->a_type = A_DOLLAR;
            iVar5 = atoi(buf + 1);
            (ptVar9->a_w).w_index = iVar5;
          }
          else {
            ptVar9->a_type = A_DOLLSYM;
            ptVar7 = gensym(buf);
            (ptVar9->a_w).w_symbol = ptVar7;
          }
        }
        else {
          ptVar9->a_type = A_SYMBOL;
          ptVar7 = gensym(buf);
          (ptVar9->a_w).w_symbol = ptVar7;
        }
      }
      uVar12 = uVar12 + 1;
      if (uVar12 == uVar11) {
        uVar10 = (int)uVar11 * 2;
        uVar11 = (ulong)uVar10;
        iVar5 = binbuf_resize(x,uVar10);
        if (iVar5 == 0) break;
        ptVar9 = x->b_vec + uVar12;
      }
      else {
        ptVar9 = ptVar9 + 1;
      }
    } while ((byte *)text != pbVar17);
    binbuf_resize(x,(int)uVar12);
  }
  return;
}

Assistant:

void binbuf_text(t_binbuf *x, const char *text, size_t size)
{
    char buf[MAXPDSTRING+1], *bufp, *ebuf = buf+MAXPDSTRING;
    const char *textp = text, *etext = text+size;
    t_atom *ap;
    int nalloc = 16, natom = 0;
    binbuf_clear(x);
    if (!binbuf_resize(x, nalloc)) return;
    ap = x->b_vec;
    while (1)
    {
        int type;
            /* skip leading space */
        while ((textp != etext) && (*textp == ' ' || *textp == '\n'
            || *textp == '\r' || *textp == '\t')) textp++;
        if (textp == etext) break;
        if (*textp == ';') SETSEMI(ap), textp++;
        else if (*textp == ',') SETCOMMA(ap), textp++;
        else
        {
                /* it's an atom other than a comma or semi */
            char c;
            int floatstate = 0, slash = 0, lastslash = 0, dollar = 0;
            bufp = buf;
            do
            {
                c = *bufp = *textp++;
                lastslash = slash;
                slash = (c == '\\');

                if (floatstate >= 0)
                {
                    int digit = (c >= '0' && c <= '9'),
                        dot = (c == '.'), minus = (c == '-'),
                        plusminus = (minus || (c == '+')),
                        expon = (c == 'e' || c == 'E');
                    if (floatstate == 0)    /* beginning */
                    {
                        if (minus) floatstate = 1;
                        else if (digit) floatstate = 2;
                        else if (dot) floatstate = 3;
                        else floatstate = -1;
                    }
                    else if (floatstate == 1)   /* got minus */
                    {
                        if (digit) floatstate = 2;
                        else if (dot) floatstate = 3;
                        else floatstate = -1;
                    }
                    else if (floatstate == 2)   /* got digits */
                    {
                        if (dot) floatstate = 4;
                        else if (expon) floatstate = 6;
                        else if (!digit) floatstate = -1;
                    }
                    else if (floatstate == 3)   /* got '.' without digits */
                    {
                        if (digit) floatstate = 5;
                        else floatstate = -1;
                    }
                    else if (floatstate == 4)   /* got '.' after digits */
                    {
                        if (digit) floatstate = 5;
                        else if (expon) floatstate = 6;
                        else floatstate = -1;
                    }
                    else if (floatstate == 5)   /* got digits after . */
                    {
                        if (expon) floatstate = 6;
                        else if (!digit) floatstate = -1;
                    }
                    else if (floatstate == 6)   /* got 'e' */
                    {
                        if (plusminus) floatstate = 7;
                        else if (digit) floatstate = 8;
                        else floatstate = -1;
                    }
                    else if (floatstate == 7)   /* got plus or minus */
                    {
                        if (digit) floatstate = 8;
                        else floatstate = -1;
                    }
                    else if (floatstate == 8)   /* got digits */
                    {
                        if (!digit) floatstate = -1;
                    }
                }
                if (!lastslash && c == '$' && (textp != etext &&
                    textp[0] >= '0' && textp[0] <= '9'))
                        dollar = 1;
                if (!slash) bufp++;
                else if (lastslash)
                {
                    bufp++;
                    slash = 0;
                }
            }
            while (textp != etext && bufp != ebuf &&
                (slash || (*textp != ' ' && *textp != '\n' && *textp != '\r'
                    && *textp != '\t' &&*textp != ',' && *textp != ';')));
            *bufp = 0;
#if 0
            post("binbuf_text: buf %s", buf);
#endif
            if (floatstate == 2 || floatstate == 4 || floatstate == 5 ||
                floatstate == 8)
                    SETFLOAT(ap, atof(buf));
                /* LATER try to figure out how to mix "$" and "\$" correctly;
                here, the backslashes were already stripped so we assume all
                "$" chars are real dollars.  In fact, we only know at least one
                was. */
            else if (dollar)
            {
                if (buf[0] != '$')
                    dollar = 0;
                for (bufp = buf+1; *bufp; bufp++)
                    if (*bufp < '0' || *bufp > '9')
                        dollar = 0;
                if (dollar)
                    SETDOLLAR(ap, atoi(buf+1));
                else SETDOLLSYM(ap, gensym(buf));
            }
            else SETSYMBOL(ap, gensym(buf));
        }
        ap++;
        natom++;
        if (natom == nalloc)
        {
            if (!binbuf_resize(x, nalloc*2)) break;
            nalloc = nalloc * 2;
            ap = x->b_vec + natom;
        }
        if (textp == etext) break;
    }
    /* reallocate the vector to exactly the right size */
    binbuf_resize(x, natom);
}